

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O0

istream * operator>>(istream *s,Am_Gesture_Trainer *tr)

{
  int iVar1;
  Gesture_Class *this;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  Am_Gesture_Trainer_Data *this_00;
  Am_Gesture_Classifier_Data *cldata;
  void *this_01;
  long *plVar5;
  Am_Value_List *this_02;
  Am_Wrapper *value;
  ostream *this_03;
  bool local_16a;
  Am_String local_d0;
  Am_Feature_Vector local_c8;
  Am_Feature_Vector fv;
  int y;
  int x;
  char buf [100];
  char local_49;
  Gesture_Class *pGStack_48;
  char check;
  Gesture_Class *cls;
  Am_Gesture_Trainer_Data *trdata;
  Am_Gesture_Classifier local_28;
  Am_Gesture_Classifier cl;
  Am_Gesture_Trainer *tr_local;
  istream *s_local;
  
  cl.data = (Am_Gesture_Classifier_Data *)tr;
  Am_Gesture_Classifier::Am_Gesture_Classifier(&local_28);
  piVar4 = operator>>(s,&local_28);
  bVar2 = std::ios::operator!((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
  if ((bVar2 & 1) == 0) {
    pGStack_48 = (Gesture_Class *)0x0;
    this_00 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    cldata = (Am_Gesture_Classifier_Data *)
             Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(&local_28);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(this_00,cldata);
    cls = (Gesture_Class *)this_00;
    bVar3 = Am_Gesture_Classifier::Trained(&local_28);
    if (bVar3) {
      Am_Gesture_Classifier::operator=((Am_Gesture_Classifier *)(cls + 1),&local_28);
    }
    else {
      Am_Gesture_Classifier::operator=
                ((Am_Gesture_Classifier *)(cls + 1),(Am_Gesture_Classifier_Data *)0x0);
    }
    piVar4 = std::operator>>(s,&local_49);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    iVar1 = (int)s;
    if ((bVar3) && (local_49 == 'x')) {
      do {
        Am_Feature_Vector::Am_Feature_Vector(&local_c8);
        std::istream::get((char *)s,(long)&y);
        bVar2 = std::ios::operator!((ios *)(s + *(long *)(*(long *)s + -0x18)));
        this = cls;
        bVar3 = true;
        if ((bVar2 & 1) == 0) {
          Am_String::Am_String(&local_d0,(char *)&y,true);
          pGStack_48 = Am_Gesture_Trainer_Data::Find_Class
                                 ((Am_Gesture_Trainer_Data *)this,&local_d0);
          bVar3 = pGStack_48 == (Gesture_Class *)0x0;
          Am_String::~Am_String(&local_d0);
        }
        if (bVar3) {
          trdata._0_4_ = 4;
        }
        else {
          while( true ) {
            this_01 = (void *)std::istream::operator>>(s,(int *)((long)&fv.data + 4));
            plVar5 = (long *)std::istream::operator>>(this_01,(int *)&fv);
            bVar3 = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
            if (!bVar3) break;
            Am_Feature_Vector::Add_Point(&local_c8,fv.data._4_4_,(int)fv.data);
          }
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)s + -0x18));
          this_02 = &pGStack_48->examples;
          value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(&local_c8);
          Am_Value_List::Add(this_02,value,Am_TAIL,true);
          trdata._0_4_ = 0;
        }
        Am_Feature_Vector::~Am_Feature_Vector(&local_c8);
        if ((int)trdata != 0) {
          if ((int)trdata == 4) {
            this_03 = std::operator<<((ostream *)&std::cerr,operator>>::bad_format);
            std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)s + -0x18));
            trdata._0_4_ = 1;
            s_local = s;
          }
          goto LAB_0021d963;
        }
        piVar4 = std::operator>>(s,&local_49);
        local_16a = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        local_16a = local_16a && local_49 == 'x';
      } while (local_16a);
    }
    bVar3 = std::ios::operator_cast_to_bool((ios *)(s + *(long *)(*(long *)s + -0x18)));
    if (bVar3) {
      std::istream::putback((char)s);
    }
    if (((cl.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type !=
        (_func_int **)0x0) {
      Am_Wrapper::Release((Am_Wrapper *)
                          ((cl.data)->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type);
    }
    ((cl.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)cls;
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)s + -0x18));
    trdata._0_4_ = 1;
    s_local = s;
  }
  else {
    trdata._0_4_ = 1;
    s_local = s;
  }
LAB_0021d963:
  Am_Gesture_Classifier::~Am_Gesture_Classifier(&local_28);
  return s_local;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Trainer &tr)
{
  // First read in a classifier (or an untrained classifier containing only
  // class names)
  Am_Gesture_Classifier cl;

  if (!(s >> cl))
    return s;

  Am_Gesture_Trainer_Data *trdata;
  Am_Gesture_Trainer_Data::Gesture_Class *cls = nullptr;
  char check;
  char buf[100];
  int x, y;

  // construct a new trainer by copying the classes in cl
  trdata = new Am_Gesture_Trainer_Data(
      (Am_Gesture_Classifier_Data *)(Am_Wrapper *)cl);

  if (cl.Trained())
    trdata->cached_classifier = cl;
  else
    trdata->cached_classifier = nullptr;

  // Now look for examples.  Examples have the check character 'x'.

  if ((s >> check) && check == 'x') {
    //AM_TRACE("Reading training examples\n");

    do {
      Am_Feature_Vector fv;

      // get the class name of this example
      s.get(buf, sizeof(buf));
      if (!s || (cls = trdata->Find_Class(buf)) == nullptr)
        goto LFail;

      // accumulate the points from this example
      while (s >> x >> y)
        fv.Add_Point(x, y);
      s.clear(std::ios::goodbit);

      cls->examples.Add(fv);

    } while ((s >> check) && check == 'x');
  }

  if (s)
    s.putback(check);

  // return the new trainer
  if (tr.data)
    tr.data->Release();
  tr.data = trdata;

  s.clear(std::ios::goodbit);
  return s;

LFail:
  static const char *bad_format = "unrecognized gesture classifier format";
  std::cerr << bad_format << std::endl;
  s.clear(std::ios::badbit);
  return s;
}